

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall OpenMD::Electrostatic::addType(Electrostatic *this,AtomType *atomType)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *this_00;
  reference piVar7;
  vector<double,_std::allocator<double>_> *yps;
  reference pvVar8;
  AtomType *in_RSI;
  long in_RDI;
  double R;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  int i;
  vector<double,_std::allocator<double>_> Jvals;
  vector<double,_std::allocator<double>_> rvals;
  RealType dr;
  RealType rval;
  CubicSplinePtr J;
  int n;
  int m;
  RealType b;
  RealType a;
  ElectrostaticAtomData eaData2;
  int fqtid2;
  int etid2;
  iterator it;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int fqtid;
  int etid;
  int atid;
  FluctuatingChargeAdapter fqa;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  ElectrostaticAtomData electrostaticAtomData;
  ElectrostaticAtomData *in_stack_fffffffffffffc98;
  ElectrostaticAtomData *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
  *in_stack_fffffffffffffcb0;
  value_type_conflict2 *in_stack_fffffffffffffcb8;
  _Rb_tree_const_iterator<int> *__new_size;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  value_type vVar10;
  errorStruct *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  FluctuatingChargeAdapter *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  int local_2a4;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  RealType in_stack_fffffffffffffda8;
  undefined4 uVar11;
  int iVar12;
  byte local_234;
  undefined4 local_218;
  _Self local_1a0;
  _Base_ptr local_198;
  _Rb_tree_const_iterator<int> local_190;
  _Base_ptr local_188;
  undefined1 local_180;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_178;
  _Base_ptr local_168;
  undefined1 local_160;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_158;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_148;
  value_type local_134;
  value_type local_130;
  uint local_12c;
  FluctuatingChargeAdapter local_128 [13];
  MultipoleAdapter local_c0 [3];
  FixedChargeAdapter local_a8;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  byte local_9d;
  byte local_9c;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  int local_80;
  RealType local_78;
  AtomType *local_10;
  
  local_10 = in_RSI;
  ElectrostaticAtomData::ElectrostaticAtomData(in_stack_fffffffffffffca0);
  local_a0 = 0;
  local_9f = 0;
  local_9e = 0;
  local_9d = 0;
  local_9c = 0;
  FixedChargeAdapter::FixedChargeAdapter(&local_a8,local_10);
  bVar4 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x40a370);
  if (bVar4) {
    local_a0 = 1;
    local_98 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffca0);
  }
  MultipoleAdapter::MultipoleAdapter(local_c0,local_10);
  bVar4 = MultipoleAdapter::isMultipole((MultipoleAdapter *)0x40a3f7);
  if (bVar4) {
    bVar4 = MultipoleAdapter::isDipole
                      ((MultipoleAdapter *)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (bVar4) {
      local_9f = 1;
      MultipoleAdapter::getDipole
                ((MultipoleAdapter *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffca0,
                 (Vector3<double> *)in_stack_fffffffffffffc98);
    }
    bVar4 = MultipoleAdapter::isQuadrupole
                      ((MultipoleAdapter *)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (bVar4) {
      local_9e = 1;
      MultipoleAdapter::getQuadrupole
                ((MultipoleAdapter *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffca0,
                 (SquareMatrix3<double> *)in_stack_fffffffffffffc98);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x40a4d1);
    }
  }
  FluctuatingChargeAdapter::FluctuatingChargeAdapter(local_128,local_10);
  bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x40a51f);
  if (bVar4) {
    local_9d = 1;
    local_9c = FluctuatingChargeAdapter::usesSlaterIntramolecular(in_stack_fffffffffffffd10);
    local_88 = FluctuatingChargeAdapter::getElectronegativity(in_stack_fffffffffffffd10);
    local_90 = FluctuatingChargeAdapter::getHardness(in_stack_fffffffffffffd10);
    local_80 = FluctuatingChargeAdapter::getSlaterN(in_stack_fffffffffffffd10);
    local_78 = FluctuatingChargeAdapter::getSlaterZeta(in_stack_fffffffffffffd10);
  }
  local_12c = AtomType::getIdent(local_10);
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x40a631);
  local_130 = (value_type)sVar5;
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x40a649);
  local_134 = (value_type)sVar5;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_fffffffffffffca0);
  pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_168 = (_Base_ptr)pVar9.first._M_node;
  local_160 = pVar9.second;
  local_158.first._M_node = local_168;
  local_158.second = (bool)local_160;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_148,&local_158);
  if ((local_148.second & 1U) == 0) {
    snprintf(painCave.errMsg,2000,"Electrostatic already had a previous entry with ident %d\n",
             (ulong)local_12c);
    painCave.severity = 3;
    painCave.isFatal = 0;
    simError();
  }
  vVar10 = local_130;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)(int)local_12c);
  *pvVar6 = vVar10;
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  push_back(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if ((local_9d & 1) != 0) {
    pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    local_188 = (_Base_ptr)pVar9.first._M_node;
    local_180 = pVar9.second;
    local_178.first._M_node = local_188;
    local_178.second = (bool)local_180;
    std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_148,&local_178);
    if ((local_148.second & 1U) == 0) {
      in_stack_fffffffffffffcd0 = &painCave;
      snprintf(painCave.errMsg,2000,
               "Electrostatic already had a previous fluctuating charge entry with ident %d\n",
               (ulong)local_12c);
      in_stack_fffffffffffffcd0->severity = 3;
      in_stack_fffffffffffffcd0->isFatal = 0;
      simError();
    }
    vVar10 = local_134;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),(long)(int)local_12c);
    *pvVar6 = vVar10;
    std::
    vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
    ::operator[]((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                  *)(in_RDI + 0xe0),(long)local_134);
    std::
    vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
    ::resize((vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
              *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_190);
    local_198 = (_Base_ptr)
                std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffc98);
    local_190._M_node = local_198;
    while( true ) {
      local_1a0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc98);
      bVar4 = std::operator!=(&local_190,&local_1a0);
      if (!bVar4) break;
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x68);
      __new_size = &local_190;
      piVar7 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffca0);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,(long)*piVar7);
      iVar12 = *pvVar6;
      yps = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0);
      piVar7 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffca0);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)yps,(long)*piVar7);
      iVar2 = *pvVar6;
      std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
      operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                  *)(in_RDI + 200),(long)iVar12);
      ElectrostaticAtomData::ElectrostaticAtomData
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      uVar11 = local_218;
      iVar12 = local_80;
      std::make_shared<OpenMD::CubicSpline>();
      if (((local_9c & 1) != 0) && ((local_234 & 1) != 0)) {
        dVar1 = *(double *)(in_RDI + 0x140);
        iVar3 = *(int *)(in_RDI + 0x250);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x40aa5e);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x40aa6b);
        for (local_2a4 = 1; local_2a4 < *(int *)(in_RDI + 0x250) + 1; local_2a4 = local_2a4 + 1) {
          R = (double)local_2a4 * ((dVar1 + 2.0) / (double)(iVar3 + -1));
          std::vector<double,_std::allocator<double>_>::push_back
                    (this_00,(value_type_conflict *)in_stack_fffffffffffffca8);
          in_stack_fffffffffffffca8 =
               (value_type *)
               sSTOCoulInt((RealType)CONCAT44(iVar12,uVar11),in_stack_fffffffffffffda8,
                           in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,R);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                     (value_type_conflict *)in_stack_fffffffffffffc98);
        }
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x40abb1);
        CubicSpline::addPoints
                  ((CubicSpline *)in_stack_fffffffffffffcd0,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(vVar10,in_stack_fffffffffffffcc8),yps);
        std::vector<double,_std::allocator<double>_>::~vector(this_00);
        std::vector<double,_std::allocator<double>_>::~vector(this_00);
      }
      in_stack_fffffffffffffca0 = (ElectrostaticAtomData *)(in_RDI + 0xe0);
      pvVar8 = std::
               vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
               ::operator[]((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                             *)in_stack_fffffffffffffca0,(long)local_134);
      std::
      vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
      ::operator[](pvVar8,(long)iVar2);
      std::shared_ptr<OpenMD::CubicSpline>::operator=
                ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffca0,
                 (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffc98);
      std::
      vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
      ::operator[]((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                    *)in_stack_fffffffffffffca0,(long)iVar2);
      std::
      vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
      ::resize((vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                *)yps,(size_type)__new_size);
      pvVar8 = std::
               vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
               ::operator[]((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                             *)(in_RDI + 0xe0),(long)iVar2);
      std::
      vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
      ::operator[](pvVar8,(long)local_134);
      std::shared_ptr<OpenMD::CubicSpline>::operator=
                ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffca0,
                 (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffc98);
      std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40ac97)
      ;
      ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x40aca4);
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffca0);
    }
  }
  ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x40acf5);
  return;
}

Assistant:

void Electrostatic::addType(AtomType* atomType) {
    ElectrostaticAtomData electrostaticAtomData;
    electrostaticAtomData.is_Charge                 = false;
    electrostaticAtomData.is_Dipole                 = false;
    electrostaticAtomData.is_Quadrupole             = false;
    electrostaticAtomData.is_Fluctuating            = false;
    electrostaticAtomData.uses_SlaterIntramolecular = false;

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);

    if (fca.isFixedCharge()) {
      electrostaticAtomData.is_Charge   = true;
      electrostaticAtomData.fixedCharge = fca.getCharge();
    }

    MultipoleAdapter ma = MultipoleAdapter(atomType);
    if (ma.isMultipole()) {
      if (ma.isDipole()) {
        electrostaticAtomData.is_Dipole = true;
        electrostaticAtomData.dipole    = ma.getDipole();
      }
      if (ma.isQuadrupole()) {
        electrostaticAtomData.is_Quadrupole = true;
        electrostaticAtomData.quadrupole    = ma.getQuadrupole();
      }
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);

    if (fqa.isFluctuatingCharge()) {
      electrostaticAtomData.is_Fluctuating = true;
      electrostaticAtomData.uses_SlaterIntramolecular =
          fqa.usesSlaterIntramolecular();
      electrostaticAtomData.electronegativity = fqa.getElectronegativity();
      electrostaticAtomData.hardness          = fqa.getHardness();
      electrostaticAtomData.slaterN           = fqa.getSlaterN();
      electrostaticAtomData.slaterZeta        = fqa.getSlaterZeta();
    }

    int atid  = atomType->getIdent();
    int etid  = Etypes.size();
    int fqtid = FQtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = Etypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Electrostatic already had a previous entry with ident %d\n",
               atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    Etids[atid] = etid;
    ElectrostaticMap.push_back(electrostaticAtomData);

    if (electrostaticAtomData.is_Fluctuating) {
      ret = FQtypes.insert(atid);
      if (ret.second == false) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "Electrostatic already had a previous fluctuating charge entry "
            "with ident %d\n",
            atid);
        painCave.severity = OPENMD_INFO;
        painCave.isFatal  = 0;
        simError();
      }
      FQtids[atid] = fqtid;
      Jij[fqtid].resize(nFlucq_);

      // Now, iterate over all known fluctuating and add to the
      // coulomb integral map:

      std::set<int>::iterator it;
      for (it = FQtypes.begin(); it != FQtypes.end(); ++it) {
        int etid2                     = Etids[(*it)];
        int fqtid2                    = FQtids[(*it)];
        ElectrostaticAtomData eaData2 = ElectrostaticMap[etid2];
        RealType a                    = electrostaticAtomData.slaterZeta;
        RealType b                    = eaData2.slaterZeta;
        int m                         = electrostaticAtomData.slaterN;
        int n                         = eaData2.slaterN;
        CubicSplinePtr J {std::make_shared<CubicSpline>()};

        // do both types actually use Slater orbitals?

        if ((electrostaticAtomData.uses_SlaterIntramolecular &&
             eaData2.uses_SlaterIntramolecular)) {
          // Create the spline of the coulombic integral for s-type
          // Slater orbitals.  Add a 2 angstrom safety window to deal
          // with cutoffGroups that have charged atoms longer than the
          // cutoffRadius away from each other.

          RealType rval;
          RealType dr = (cutoffRadius_ + 2.0) / RealType(np_ - 1);
          vector<RealType> rvals;
          vector<RealType> Jvals;
          // RealType j0, j0c, j1c;
          // don't start at i = 0, as rval = 0 is undefined for the
          // slater overlap integrals.
          for (int i = 1; i < np_ + 1; i++) {
            rval = RealType(i) * dr;
            rvals.push_back(rval);

            Jvals.push_back(
                sSTOCoulInt(a, b, m, n, rval * Constants::angstromToBohr) *
                Constants::hartreeToKcal);
          }

          J->addPoints(rvals, Jvals);
        }
        Jij[fqtid][fqtid2] = J;
        Jij[fqtid2].resize(nFlucq_);
        Jij[fqtid2][fqtid] = J;
      }
    }
    return;
  }